

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AngleR.cpp
# Opt level: O0

void __thiscall
OpenMD::AngleR::AngleR
          (AngleR *this,SimInfo *info,string *filename,string *sele1,int seleOffset,RealType len,
          int nrbins)

{
  bool bVar1;
  ostream *poVar2;
  StaticAnalyser *this_00;
  string *in_RCX;
  undefined8 *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  undefined8 in_XMM0_Qa;
  string paramString;
  stringstream params;
  undefined4 in_stack_fffffffffffffcc8;
  uint in_stack_fffffffffffffccc;
  StaticAnalyser *in_stack_fffffffffffffcd0;
  SimInfo *in_stack_fffffffffffffcd8;
  StaticAnalyser *in_stack_fffffffffffffce0;
  size_type in_stack_fffffffffffffce8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffcf0;
  allocator<char> *__a;
  SelectionEvaluator *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  string *script;
  SelectionEvaluator *this_03;
  string local_2b0 [32];
  stringstream local_290 [16];
  ostream local_280 [72];
  SimInfo *in_stack_fffffffffffffdc8;
  SelectionEvaluator *in_stack_fffffffffffffdd0;
  string local_108 [32];
  string local_e8 [39];
  allocator<char> local_c1;
  string local_c0 [56];
  SimInfo *in_stack_ffffffffffffff78;
  SelectionManager *in_stack_ffffffffffffff80;
  string local_68 [52];
  undefined4 local_34;
  undefined8 local_30;
  undefined4 local_24;
  string *local_20;
  
  local_34 = in_R9D;
  local_30 = in_XMM0_Qa;
  local_24 = in_R8D;
  local_20 = in_RCX;
  StaticAnalyser::StaticAnalyser
            (in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,(string *)in_stack_fffffffffffffcd0
             ,in_stack_fffffffffffffccc);
  *in_RDI = &PTR__AngleR_0055e748;
  *(undefined1 *)(in_RDI + 0x1a) = 0;
  *(undefined1 *)((long)in_RDI + 0xd1) = 1;
  *(undefined1 *)((long)in_RDI + 0xd2) = 0;
  std::__cxx11::string::string((string *)(in_RDI + 0x1b),local_20);
  std::__cxx11::string::string((string *)(in_RDI + 0x1f));
  SelectionManager::SelectionManager(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  SelectionManager::SelectionManager(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  this_03 = (SelectionEvaluator *)(in_RDI + 0x55);
  SelectionEvaluator::SelectionEvaluator(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  script = (string *)(in_RDI + 0xff);
  SelectionEvaluator::SelectionEvaluator(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  *(undefined4 *)(in_RDI + 0x1a9) = local_24;
  in_RDI[0x1ab] = local_30;
  *(undefined4 *)(in_RDI + 0x1ac) = local_34;
  __a = (allocator<char> *)(in_RDI + 0x1ae);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x131542);
  this_01 = (SelectionEvaluator *)(in_RDI + 0x1b1);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x131558);
  this_02 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0x1b4);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x13156e);
  getPrefix((string *)in_stack_fffffffffffffcd8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffcd8,(char *)in_stack_fffffffffffffcd0);
  StaticAnalyser::setOutputName
            (in_stack_fffffffffffffcd0,
             (string *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
  SelectionEvaluator::loadScriptString(this_03,script);
  bVar1 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0x55));
  if (!bVar1) {
    in_stack_fffffffffffffcf0 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0x23);
    SelectionEvaluator::evaluate(this_01);
    SelectionManager::setSelectionSet
              ((SelectionManager *)in_stack_fffffffffffffce0,
               (SelectionSet *)in_stack_fffffffffffffcd8);
    SelectionSet::~SelectionSet((SelectionSet *)0x13165b);
  }
  in_RDI[0x1ad] = (double)in_RDI[0x1ab] / (double)*(int *)(in_RDI + 0x1ac);
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffcf0,
             in_stack_fffffffffffffce8);
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_02,(char *)this_01,__a);
  StaticAnalyser::setAnalysisType
            (in_stack_fffffffffffffcd0,
             (string *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator(&local_c1);
  getPrefix((string *)in_stack_fffffffffffffcd8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffcd8,(char *)in_stack_fffffffffffffcd0);
  StaticAnalyser::setOutputName
            (in_stack_fffffffffffffcd0,
             (string *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
  std::__cxx11::string::~string(local_e8);
  std::__cxx11::string::~string(local_108);
  std::__cxx11::stringstream::stringstream(local_290);
  poVar2 = std::operator<<(local_280," len = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(double)in_RDI[0x1ab]);
  this_00 = (StaticAnalyser *)std::operator<<(poVar2,", nrbins = ");
  std::ostream::operator<<(this_00,*(int *)(in_RDI + 0x1ac));
  std::__cxx11::stringstream::str();
  StaticAnalyser::setParameterString
            (this_00,(string *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
  std::__cxx11::string::~string(local_2b0);
  std::__cxx11::stringstream::~stringstream(local_290);
  return;
}

Assistant:

AngleR::AngleR(SimInfo* info, const std::string& filename,
                 const std::string& sele1, int seleOffset, RealType len,
                 int nrbins) :
      StaticAnalyser(info, filename, nrbins),
      doVect_(false), doOffset_(true), doOffset2_(false),
      selectionScript1_(sele1), seleMan1_(info), seleMan2_(info),
      evaluator1_(info), evaluator2_(info), seleOffset_(seleOffset), len_(len),
      nRBins_(nrbins) {
    setOutputName(getPrefix(filename) + ".AngleR");

    evaluator1_.loadScriptString(sele1);
    if (!evaluator1_.isDynamic()) {
      seleMan1_.setSelectionSet(evaluator1_.evaluate());
    }

    deltaR_ = len_ / nRBins_;

    histogram_.resize(nRBins_);
    count_.resize(nRBins_);
    avgAngleR_.resize(nRBins_);

    setAnalysisType("radial density function Angle(r)");
    setOutputName(getPrefix(filename) + ".AngleR");
    std::stringstream params;
    params << " len = " << len_ << ", nrbins = " << nRBins_;
    const std::string paramString = params.str();
    setParameterString(paramString);
  }